

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O0

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Parenthesizer::~Parenthesizer
          (Parenthesizer *this)

{
  BasicWriter<char> *in_RDI;
  char in_stack_ffffffffffffffef;
  
  *(undefined4 *)(in_RDI->_vptr_BasicWriter + 2) = *(undefined4 *)&in_RDI->buffer_;
  if (((ulong)in_RDI->buffer_ & 0x100000000) != 0) {
    fmt::BasicWriter<char>::operator<<(in_RDI,in_stack_ffffffffffffffef);
  }
  return;
}

Assistant:

ExprWriter<ExprTypes, VarNamer>::Parenthesizer::~Parenthesizer() {
  writer_.precedence_ = saved_precedence_;
  if (write_paren_)
    writer_.writer_ << ')';
}